

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::POMDPXGreedyActionPolicy::Action
          (POMDPXGreedyActionPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  pointer ppSVar2;
  ACT_TYPE AVar3;
  int iVar4;
  State *pSVar5;
  ACT_TYPE AVar6;
  int i;
  ulong uVar7;
  ACT_TYPE action;
  int action_00;
  double dVar8;
  double dVar9;
  double local_40;
  
  local_40 = -INFINITY;
  AVar6 = 0;
  for (action_00 = 0; iVar4 = (*(this->pomdpx_model_->super_MDP)._vptr_MDP[3])(), action_00 < iVar4;
      action_00 = action_00 + 1) {
    dVar9 = 0.0;
    for (uVar7 = 0;
        ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(particles->
                              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3);
        uVar7 = uVar7 + 1) {
      pSVar5 = ppSVar2[uVar7];
      dVar1 = pSVar5->weight;
      pSVar5 = pSVar5 + 1;
      dVar8 = Parser::GetReward(this->pomdpx_model_->parser_,
                                (vector<int,_std::allocator<int>_> *)pSVar5,
                                (vector<int,_std::allocator<int>_> *)pSVar5,action_00);
      dVar9 = dVar9 + dVar8 * dVar1;
    }
    AVar3 = action_00;
    if (dVar9 <= local_40) {
      dVar9 = local_40;
      AVar3 = AVar6;
    }
    local_40 = dVar9;
    AVar6 = AVar3;
  }
  return AVar6;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		ACT_TYPE bestAction = 0;
		double maxReward = Globals::NEG_INFTY;
		for (ACT_TYPE action = 0; action < pomdpx_model_->NumActions(); action++) {
			double reward = 0;
			for (int i = 0; i < particles.size(); i++) {
				State* particle = particles[i];
				POMDPXState* state = static_cast<POMDPXState*>(particle);
				reward += state->weight
					* pomdpx_model_->parser_->GetReward(state->vec_id,
						state->vec_id, action);
			}
			if (reward > maxReward) {
				maxReward = reward;
				bestAction = action;
			}
		}
		return bestAction;
	}